

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeH1.cpp
# Opt level: O0

void TPZShapeH1<pzshape::TPZShapeTetra>::Shape(TPZVec<double> *pt,TPZShapeData *data)

{
  double dVar1;
  double dVar2;
  int64_t iVar3;
  double *pdVar4;
  TPZFMatrix<double> *pTVar5;
  long in_RSI;
  double dVar6;
  double dVar7;
  int xj_1;
  int i_1;
  int xj;
  int i;
  TPZFMatrix<double> *mult;
  TPZFNMatrix<1,_double> auxmat;
  int opt;
  REAL beta;
  REAL alpha;
  TPZManVector<double,_3> outvec;
  TPZFNMatrix<100,_double> dphiaux2;
  TPZFNMatrix<100,_double> dphiaux;
  TPZFNMatrix<100,_double> dphin;
  TPZFNMatrix<100,_double> phin;
  int sidedim;
  TPZTransform<double> *transform;
  int d_1;
  int numshape;
  int side;
  int shape;
  int d;
  int nod;
  TPZFNMatrix<45,_double> dphiblend;
  TPZFNMatrix<45,_double> phiblend;
  int NCorners;
  int NSides;
  int dim;
  TPZFMatrix<double> *in_stack_ffffffffffffea40;
  TPZFMatrix<double> *in_stack_ffffffffffffea48;
  double *in_stack_ffffffffffffea50;
  TPZVec<double> *in_stack_ffffffffffffea58;
  TPZFNMatrix<100,_double> *in_stack_ffffffffffffea60;
  TPZFMatrix<double> *in_stack_ffffffffffffea68;
  TPZTransform<double> *in_stack_ffffffffffffea70;
  double *in_stack_ffffffffffffea78;
  TPZFNMatrix<1,_double> *in_stack_ffffffffffffea80;
  int local_1448;
  int local_1444;
  int local_1440;
  int local_143c;
  undefined1 local_1428 [164];
  undefined4 local_1384;
  undefined8 local_1380;
  undefined8 local_1378;
  TPZFMatrix<double> *in_stack_ffffffffffffed00;
  TPZFMatrix<double> *in_stack_ffffffffffffed08;
  TPZVec<double> *in_stack_ffffffffffffed10;
  undefined1 local_f80 [952];
  undefined1 local_bc8 [1908];
  int local_454;
  TPZTransform<double> *local_450;
  int local_444;
  int local_440;
  int local_43c;
  int local_438;
  int local_434;
  int local_430;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  long local_10;
  
  local_10 = in_RSI;
  pzshape::TPZShapeTetra::ShapeCorner
            ((TPZVec<double> *)in_stack_ffffffffffffea70,in_stack_ffffffffffffea68,
             &in_stack_ffffffffffffea60->super_TPZFMatrix<double>);
  iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)(local_10 + 0x22a0));
  if (iVar3 != 4) {
    local_14 = 3;
    local_18 = 0xf;
    local_1c = 4;
    TPZFNMatrix<45,_double>::TPZFNMatrix
              ((TPZFNMatrix<45,_double> *)in_stack_ffffffffffffea60,
               (int64_t)in_stack_ffffffffffffea58,(int64_t)in_stack_ffffffffffffea50);
    TPZFNMatrix<45,_double>::TPZFNMatrix
              ((TPZFNMatrix<45,_double> *)in_stack_ffffffffffffea60,
               (int64_t)in_stack_ffffffffffffea58,(int64_t)in_stack_ffffffffffffea50);
    for (local_430 = 0; local_430 < 4; local_430 = local_430 + 1) {
      pdVar4 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffea60->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffea58,(int64_t)in_stack_ffffffffffffea50);
      dVar6 = *pdVar4;
      pdVar4 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffea60->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffea58,(int64_t)in_stack_ffffffffffffea50);
      *pdVar4 = dVar6;
      for (local_434 = 0; local_434 < 3; local_434 = local_434 + 1) {
        pdVar4 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffea60->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffea58,(int64_t)in_stack_ffffffffffffea50);
        dVar6 = *pdVar4;
        pdVar4 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffea60->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffea58,(int64_t)in_stack_ffffffffffffea50);
        *pdVar4 = dVar6;
      }
    }
    pzshape::TPZShapeTetra::ShapeGenerating
              (in_stack_ffffffffffffed10,in_stack_ffffffffffffed08,in_stack_ffffffffffffed00);
    local_438 = 4;
    for (local_43c = 4; local_43c < 0xf; local_43c = local_43c + 1) {
      TPZVec<int>::operator[]((TPZVec<int> *)(local_10 + 0x70),(long)(local_43c + -4));
      local_440 = pzshape::TPZShapeTetra::NConnectShapeF
                            ((int)in_stack_ffffffffffffea50,
                             (int)((ulong)in_stack_ffffffffffffea48 >> 0x20));
      if (local_440 != 0) {
        pdVar4 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffea60->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffea58,(int64_t)in_stack_ffffffffffffea50);
        dVar6 = *pdVar4;
        pdVar4 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffea60->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffea58,(int64_t)in_stack_ffffffffffffea50);
        *pdVar4 = dVar6;
        for (local_444 = 0; local_444 < 3; local_444 = local_444 + 1) {
          pdVar4 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffea60->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffea58,(int64_t)in_stack_ffffffffffffea50)
          ;
          dVar6 = *pdVar4;
          pdVar4 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffea60->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffea58,(int64_t)in_stack_ffffffffffffea50)
          ;
          *pdVar4 = dVar6;
        }
        local_438 = local_438 + 1;
        if (local_440 != 1) {
          local_450 = TPZVec<TPZTransform<double>_>::operator[]
                                ((TPZVec<TPZTransform<double>_> *)(local_10 + 400),
                                 (long)(local_43c + -4));
          local_454 = pztopology::TPZTetrahedron::SideDimension(0x18a062f);
          TPZFNMatrix<100,_double>::TPZFNMatrix
                    (in_stack_ffffffffffffea60,(int64_t)in_stack_ffffffffffffea58,
                     (int64_t)in_stack_ffffffffffffea50);
          TPZFNMatrix<100,_double>::TPZFNMatrix
                    (in_stack_ffffffffffffea60,(int64_t)in_stack_ffffffffffffea58,
                     (int64_t)in_stack_ffffffffffffea50);
          TPZFNMatrix<100,_double>::TPZFNMatrix
                    (in_stack_ffffffffffffea60,(int64_t)in_stack_ffffffffffffea58,
                     (int64_t)in_stack_ffffffffffffea50);
          TPZFNMatrix<100,_double>::TPZFNMatrix
                    (in_stack_ffffffffffffea60,(int64_t)in_stack_ffffffffffffea58,
                     (int64_t)in_stack_ffffffffffffea50);
          TPZManVector<double,_3>::TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_ffffffffffffea60,
                     (int64_t)in_stack_ffffffffffffea58);
          TPZTransform<double>::Apply
                    (in_stack_ffffffffffffea70,(TPZVec<double> *)in_stack_ffffffffffffea68,
                     (TPZVec<double> *)in_stack_ffffffffffffea60);
          TPZVec<int>::operator[]((TPZVec<int> *)(local_10 + 0x70),(long)(local_43c + -4));
          pzshape::TPZShapeTetra::ShapeInternal
                    ((int)((ulong)in_stack_ffffffffffffea60 >> 0x20),in_stack_ffffffffffffea58,
                     (int)((ulong)in_stack_ffffffffffffea50 >> 0x20),in_stack_ffffffffffffea48,
                     in_stack_ffffffffffffea40);
          if (local_454 < 3) {
            local_1378 = 0x3ff0000000000000;
            local_1380 = 0;
            local_1384 = 1;
            TPZFNMatrix<1,_double>::TPZFNMatrix
                      (in_stack_ffffffffffffea80,(int64_t)in_stack_ffffffffffffea78,
                       (int64_t)in_stack_ffffffffffffea70,(double *)in_stack_ffffffffffffea68);
            pTVar5 = TPZTransform<double>::Mult(local_450);
            (*(pTVar5->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x27])(0x3ff0000000000000,0,pTVar5,local_bc8,local_1428,local_f80,1);
            for (local_143c = 1; local_143c < local_440; local_143c = local_143c + 1) {
              pdVar4 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffea60->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffea58,
                                  (int64_t)in_stack_ffffffffffffea50);
              dVar6 = *pdVar4;
              pdVar4 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffea60->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffea58,
                                  (int64_t)in_stack_ffffffffffffea50);
              dVar7 = *pdVar4;
              pdVar4 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffea60->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffea58,
                                  (int64_t)in_stack_ffffffffffffea50);
              *pdVar4 = dVar6 * dVar7;
              for (local_1440 = 0; local_1440 < 3; local_1440 = local_1440 + 1) {
                pdVar4 = TPZFMatrix<double>::operator()
                                   (&in_stack_ffffffffffffea60->super_TPZFMatrix<double>,
                                    (int64_t)in_stack_ffffffffffffea58,
                                    (int64_t)in_stack_ffffffffffffea50);
                dVar6 = *pdVar4;
                pdVar4 = TPZFMatrix<double>::operator()
                                   (&in_stack_ffffffffffffea60->super_TPZFMatrix<double>,
                                    (int64_t)in_stack_ffffffffffffea58,
                                    (int64_t)in_stack_ffffffffffffea50);
                dVar7 = *pdVar4;
                pdVar4 = TPZFMatrix<double>::operator()
                                   (&in_stack_ffffffffffffea60->super_TPZFMatrix<double>,
                                    (int64_t)in_stack_ffffffffffffea58,
                                    (int64_t)in_stack_ffffffffffffea50);
                dVar1 = *pdVar4;
                pdVar4 = TPZFMatrix<double>::operator()
                                   (&in_stack_ffffffffffffea60->super_TPZFMatrix<double>,
                                    (int64_t)in_stack_ffffffffffffea58,
                                    (int64_t)in_stack_ffffffffffffea50);
                dVar2 = *pdVar4;
                pdVar4 = TPZFMatrix<double>::operator()
                                   (&in_stack_ffffffffffffea60->super_TPZFMatrix<double>,
                                    (int64_t)in_stack_ffffffffffffea58,
                                    (int64_t)in_stack_ffffffffffffea50);
                *pdVar4 = dVar6 * dVar7 + dVar1 * dVar2;
              }
              local_438 = local_438 + 1;
            }
            TPZFNMatrix<1,_double>::~TPZFNMatrix((TPZFNMatrix<1,_double> *)0x18a0b41);
          }
          else {
            for (local_1444 = 1; local_1444 < local_440; local_1444 = local_1444 + 1) {
              pdVar4 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffea60->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffea58,
                                  (int64_t)in_stack_ffffffffffffea50);
              dVar6 = *pdVar4;
              pdVar4 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffea60->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffea58,
                                  (int64_t)in_stack_ffffffffffffea50);
              in_stack_ffffffffffffea80 = (TPZFNMatrix<1,_double> *)(dVar6 * *pdVar4);
              pdVar4 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffea60->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffea58,
                                  (int64_t)in_stack_ffffffffffffea50);
              *pdVar4 = (double)in_stack_ffffffffffffea80;
              for (local_1448 = 0; local_1448 < 3; local_1448 = local_1448 + 1) {
                in_stack_ffffffffffffea78 =
                     TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffea60->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffea58,
                                (int64_t)in_stack_ffffffffffffea50);
                in_stack_ffffffffffffea68 = (TPZFMatrix<double> *)*in_stack_ffffffffffffea78;
                in_stack_ffffffffffffea70 =
                     (TPZTransform<double> *)
                     TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffea60->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffea58,
                                (int64_t)in_stack_ffffffffffffea50);
                in_stack_ffffffffffffea58 =
                     (TPZVec<double> *)
                     (in_stack_ffffffffffffea70->super_TPZSavable)._vptr_TPZSavable;
                in_stack_ffffffffffffea60 =
                     (TPZFNMatrix<100,_double> *)
                     TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffea60->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffea58,
                                (int64_t)in_stack_ffffffffffffea50);
                in_stack_ffffffffffffea48 =
                     (TPZFMatrix<double> *)
                     (in_stack_ffffffffffffea60->super_TPZFMatrix<double>).super_TPZMatrix<double>.
                     super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable;
                in_stack_ffffffffffffea50 =
                     TPZFMatrix<double>::operator()
                               ((TPZFMatrix<double> *)in_stack_ffffffffffffea60,
                                (int64_t)in_stack_ffffffffffffea58,
                                (int64_t)in_stack_ffffffffffffea50);
                dVar7 = (double)in_stack_ffffffffffffea48 * *in_stack_ffffffffffffea50;
                dVar6 = (double)in_stack_ffffffffffffea68 * (double)in_stack_ffffffffffffea58;
                in_stack_ffffffffffffea40 =
                     (TPZFMatrix<double> *)
                     TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffea60->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffea58,
                                (int64_t)in_stack_ffffffffffffea50);
                (in_stack_ffffffffffffea40->super_TPZMatrix<double>).super_TPZBaseMatrix.
                super_TPZSavable._vptr_TPZSavable = (_func_int **)(dVar6 + dVar7);
              }
              local_438 = local_438 + 1;
            }
          }
          TPZManVector<double,_3>::~TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_ffffffffffffea40);
          TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x18a0d93);
          TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x18a0da0);
          TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x18a0dad);
          TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x18a0dba);
        }
      }
    }
    TPZFNMatrix<45,_double>::~TPZFNMatrix((TPZFNMatrix<45,_double> *)0x18a0e20);
    TPZFNMatrix<45,_double>::~TPZFNMatrix((TPZFNMatrix<45,_double> *)0x18a0e2d);
  }
  return;
}

Assistant:

void TPZShapeH1<TSHAPE>::Shape(const TPZVec<REAL> &pt, TPZShapeData &data) {

    
//    TPZVec<REAL> &pt = par.pt;
//    TPZFMatrix<REAL> &phi = par.phi;
//    TPZFMatrix<REAL> &dphi = par.dphi;
    
    TSHAPE::ShapeCorner(pt,data.fPhi,data.fDPhi);
    
    if(data.fPhi.Rows() == TSHAPE::NCornerNodes) return;
    
    const int dim = TSHAPE::Dimension;
    const int NSides = TSHAPE::NSides;
    const int NCorners = TSHAPE::NCornerNodes;

    TPZFNMatrix<NSides*dim,REAL> phiblend(NSides,1),dphiblend(dim,NSides);
    for(int nod=0; nod<NCorners; nod++)
    {
        phiblend(nod,0) = data.fPhi(nod,0);
        for(int d=0; d< dim; d++)
        {
            dphiblend(d,nod) = data.fDPhi(d,nod);
        }
    }
    TSHAPE::ShapeGenerating(pt, phiblend, dphiblend);
    int shape = NCorners;
    for (int side = NCorners; side<NSides ; side++)
    {
        int numshape = TSHAPE::NConnectShapeF(side, data.fH1ConnectOrders[side-NCorners]);
        if(numshape == 0) continue;
        
        data.fPhi(shape,0) = phiblend(side,0);
        for(int d=0; d<dim; d++) data.fDPhi(d,shape) = dphiblend(d,side);
        shape++;
        
        if(numshape == 1) continue;
        
        TPZTransform<REAL> &transform = data.fSideTransforms[side - NCorners];
        int sidedim = TSHAPE::SideDimension(side);
        TPZFNMatrix<100,REAL> phin(numshape,1), dphin(sidedim,numshape), dphiaux(TSHAPE::Dimension,numshape),
            dphiaux2(TSHAPE::Dimension,numshape);
        TPZManVector<REAL,3> outvec(sidedim);
        transform.Apply(pt, outvec);
//        dphin.Zero();
        TSHAPE::ShapeInternal(side, outvec,data.fH1ConnectOrders[side - NCorners], phin, dphin);
        if(sidedim < 3)
        {
            constexpr REAL alpha = 1.;
            constexpr REAL beta = 0.;
            constexpr int opt = 1;
            TPZFNMatrix<1,REAL> auxmat(1,1,0);    
            TPZFMatrix<REAL> &mult = transform.Mult();
            mult.MultAdd(dphin, auxmat, dphiaux,alpha,beta,opt);
            
            for (int i = 1; i < numshape; i++) {
                data.fPhi(shape,0) = phiblend(side,0)*phin(i,0);
                for(int xj=0;xj<TSHAPE::Dimension;xj++) {
                    data.fDPhi(xj,shape) = dphiblend(xj,side)*phin(i,0)+phiblend(side,0)*dphiaux(xj,i);
                }
                shape++;
            }
        } else
        {
            for (int i = 1; i < numshape; i++) {
                data.fPhi(shape,0) = phiblend(side,0)*phin(i,0);
                for(int xj=0;xj<TSHAPE::Dimension;xj++) {
                    data.fDPhi(xj,shape) = dphiblend(xj,side)*phin(i,0)+phiblend(side,0)*dphin(xj,i);
                }
                shape++;
            }

        }
    }
    
}